

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Entry * __thiscall
kj::
Table<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>_>
::insert(Table<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Callbacks>_>
         *this,Entry *row)

{
  RemoveConst<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
  *pRVar1;
  Entry *pEVar2;
  uint uVar3;
  RemoveConst<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>
  *pRVar4;
  size_t sVar5;
  Impl<0UL,_false> local_28 [16];
  
  Impl<0UL,_false>::insert
            (local_28,this,
             ((long)(this->rows).builder.pos - (long)(this->rows).builder.ptr >> 3) *
             0x6db6db6db6db6db7,row,0xffffffff);
  if (local_28[0] != (Impl<0UL,_false>)0x1) {
    pRVar4 = (this->rows).builder.pos;
    if (pRVar4 == (this->rows).builder.endPtr) {
      pRVar1 = (this->rows).builder.ptr;
      sVar5 = 4;
      if (pRVar4 != pRVar1) {
        sVar5 = ((long)pRVar4 - (long)pRVar1 >> 3) * -0x2492492492492492;
      }
      Vector<kj::HashMap<kj::StringPtr,_capnp::JsonCodec::AnnotatedHandler::FieldNameInfo>::Entry>::
      setCapacity(&this->rows,sVar5);
      pRVar4 = (this->rows).builder.pos;
    }
    sVar5 = (row->key).content.size_;
    (pRVar4->key).content.ptr = (row->key).content.ptr;
    (pRVar4->key).content.size_ = sVar5;
    uVar3 = (row->value).index;
    (pRVar4->value).type = (row->value).type;
    (pRVar4->value).index = uVar3;
    (pRVar4->value).prefixLength = (row->value).prefixLength;
    (pRVar4->value).ownName.content.ptr = (row->value).ownName.content.ptr;
    (pRVar4->value).ownName.content.size_ = (row->value).ownName.content.size_;
    (pRVar4->value).ownName.content.disposer = (row->value).ownName.content.disposer;
    (row->value).ownName.content.ptr = (char *)0x0;
    (row->value).ownName.content.size_ = 0;
    pEVar2 = (this->rows).builder.pos;
    (this->rows).builder.pos = pEVar2 + 1;
    return pEVar2;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  if (kj::none != Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }
}